

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

s3wid_t dict_add_word(dict_t *d,char *word,s3cipid_t *p,int32 np)

{
  int32 iVar1;
  void *pvVar2;
  char *pcVar3;
  s3cipid_t *psVar4;
  int iStack_48;
  s3wid_t w;
  void *val;
  dictword_t *pdStack_38;
  s3wid_t newwid;
  dictword_t *wordp;
  int32 len;
  int32 np_local;
  s3cipid_t *p_local;
  char *word_local;
  dict_t *d_local;
  
  wordp._4_4_ = np;
  _len = p;
  p_local = (s3cipid_t *)word;
  word_local = (char *)d;
  if (d->n_word < d->max_words) {
    pdStack_38 = d->word + d->n_word;
    pcVar3 = __ckd_salloc__(word,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                            ,0xb5);
    pdStack_38->word = pcVar3;
    pvVar2 = hash_table_enter(*(hash_table_t **)(word_local + 0x28),pdStack_38->word,
                              (void *)(long)*(int *)(word_local + 0x34));
    if (pvVar2 == (void *)(long)*(int *)(word_local + 0x34)) {
      if ((_len == (s3cipid_t *)0x0) || (wordp._4_4_ < 1)) {
        pdStack_38->ciphone = (s3cipid_t *)0x0;
        pdStack_38->pronlen = 0;
      }
      else {
        psVar4 = (s3cipid_t *)
                 __ckd_malloc__((long)wordp._4_4_ << 1,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                                ,0xbf);
        pdStack_38->ciphone = psVar4;
        memcpy(pdStack_38->ciphone,_len,(long)wordp._4_4_ << 1);
        pdStack_38->pronlen = wordp._4_4_;
      }
      pdStack_38->alt = -1;
      pdStack_38->basewid = *(s3wid_t *)(word_local + 0x34);
      wordp._0_4_ = dict_word2basestr((char *)p_local);
      if (0 < (int32)wordp) {
        iVar1 = hash_table_lookup(*(hash_table_t **)(word_local + 0x28),(char *)p_local,
                                  (void **)&iStack_48);
        if (iVar1 < 0) {
          *(undefined1 *)((long)p_local + (long)(int32)wordp) = 0x28;
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                  ,0xd2,"Missing base word for \'%s\'\n",p_local);
          exit(1);
        }
        *(undefined1 *)((long)p_local + (long)(int32)wordp) = 0x28;
        pdStack_38->basewid = iStack_48;
        pdStack_38->alt = *(s3wid_t *)(*(long *)(word_local + 0x20) + (long)iStack_48 * 0x20 + 0x14)
        ;
        *(undefined4 *)(*(long *)(word_local + 0x20) + (long)iStack_48 * 0x20 + 0x14) =
             *(undefined4 *)(word_local + 0x34);
      }
      d_local._4_4_ = *(int *)(word_local + 0x34);
      *(int *)(word_local + 0x34) = d_local._4_4_ + 1;
    }
    else {
      ckd_free(pdStack_38->word);
      d_local._4_4_ = -1;
    }
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
            ,0xaa,"Dictionary max size (%d) exceeded; reallocate another entries %d \n",
            (ulong)(uint)d->max_words,0x1000);
    pvVar2 = __ckd_realloc__(*(void **)(word_local + 0x20),
                             (long)(*(int *)(word_local + 0x30) + 0x1000) << 5,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/dict.c"
                             ,0xae);
    *(void **)(word_local + 0x20) = pvVar2;
    *(int *)(word_local + 0x30) = *(int *)(word_local + 0x30) + 0x1000;
    d_local._4_4_ = -1;
  }
  return d_local._4_4_;
}

Assistant:

s3wid_t
dict_add_word(dict_t * d, char *word, s3cipid_t * p, int32 np)
{
    int32 len;
    dictword_t *wordp;
    s3wid_t newwid;

    if (d->n_word >= d->max_words) {
        E_INFO
            ("Dictionary max size (%d) exceeded; reallocate another entries %d \n",
             d->max_words, DICT_INC_SZ);
        d->word =
            (dictword_t *) ckd_realloc(d->word,
                                       (d->max_words +
                                        DICT_INC_SZ) * sizeof(dictword_t));
        d->max_words = d->max_words + DICT_INC_SZ;

        return (BAD_S3WID);
    }

    wordp = d->word + d->n_word;
    wordp->word = (char *) ckd_salloc(word);    /* Freed in dict_free */

    /* Associate word string with d->n_word in hash table */
    if (hash_table_enter(d->ht, wordp->word, (void *)(long)d->n_word) != (void *)(long)d->n_word) {
        ckd_free(wordp->word);
        return (BAD_S3WID);
    }

    /* Fill in word entry, and set defaults */
    if (p && (np > 0)) {
        wordp->ciphone = (s3cipid_t *) ckd_malloc(np * sizeof(s3cipid_t));      /* Freed in dict_free */
        memcpy(wordp->ciphone, p, np * sizeof(s3cipid_t));
        wordp->pronlen = np;
    }
    else {
        wordp->ciphone = NULL;
        wordp->pronlen = 0;
    }
    wordp->alt = BAD_S3WID;
    wordp->basewid = d->n_word;

    /* Determine base/alt wids */
    if ((len = dict_word2basestr(word)) > 0) {
	void *val;
	s3wid_t w;

        /* Truncated to a baseword string; find its ID */
        if (hash_table_lookup(d->ht, word, &val) < 0) {
            word[len] = '(';    /* Get back the original word */
            E_FATAL("Missing base word for '%s'\n", word);
        }
        else
            word[len] = '(';    /* Get back the original word */

        /* Link into alt list */
	w = (s3wid_t)(long)val;
        wordp->basewid = w;
        wordp->alt = d->word[w].alt;
        d->word[w].alt = d->n_word;
    }

    newwid = d->n_word++;

    return (newwid);
}